

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndGroup(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  float fVar4;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  undefined1 local_30 [8];
  ImRect group_bb;
  ImGuiGroupData *group_data;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  pIVar3 = GetCurrentWindow();
  bVar2 = ImVector<ImGuiGroupData>::empty(&(pIVar3->DC).GroupStack);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!window->DC.GroupStack.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0x23d6,"void ImGui::EndGroup()");
  }
  group_bb.Max = (ImVec2)ImVector<ImGuiGroupData>::back(&(pIVar3->DC).GroupStack);
  ImRect::ImRect((ImRect *)local_30,(ImVec2 *)group_bb.Max,&(pIVar3->DC).CursorMaxPos);
  group_bb.Min.y = group_bb.Min.y - (pIVar1->Style).ItemSpacing.y;
  local_38 = ImMax((ImVec2 *)local_30,&group_bb.Min);
  (pIVar3->DC).CursorPos = *(ImVec2 *)group_bb.Max;
  group_bb.Min = local_38;
  local_40 = ImMax((ImVec2 *)((long)group_bb.Max + 8),&(pIVar3->DC).CursorMaxPos);
  (pIVar3->DC).CursorMaxPos = local_40;
  (pIVar3->DC).CurrentLineHeight = *(float *)((long)group_bb.Max + 0x18);
  (pIVar3->DC).CurrentLineTextBaseOffset = *(float *)((long)group_bb.Max + 0x1c);
  (pIVar3->DC).IndentX = *(float *)((long)group_bb.Max + 0x10);
  (pIVar3->DC).GroupOffsetX = *(float *)((long)group_bb.Max + 0x14);
  (pIVar3->DC).LogLinePosY = (pIVar3->DC).CursorPos.y - 9999.0;
  if ((*(byte *)((long)group_bb.Max + 0x25) & 1) != 0) {
    fVar4 = ImMax((pIVar3->DC).PrevLineTextBaseOffset,*(float *)((long)group_bb.Max + 0x1c));
    (pIVar3->DC).CurrentLineTextBaseOffset = fVar4;
    local_48 = ImRect::GetSize((ImRect *)local_30);
    ItemSize(&local_48,*(float *)((long)group_bb.Max + 0x1c));
    ItemAdd((ImRect *)local_30,(ImGuiID *)0x0);
  }
  if (((((*(byte *)((long)group_bb.Max + 0x24) & 1) == 0) && ((pIVar1->ActiveIdIsAlive & 1U) != 0))
      && (pIVar1->ActiveId != 0)) && (pIVar1->ActiveIdWindow->RootWindow == pIVar3->RootWindow)) {
    (pIVar3->DC).LastItemId = pIVar1->ActiveId;
  }
  ImVector<ImGuiGroupData>::pop_back(&(pIVar3->DC).GroupStack);
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(!window->DC.GroupStack.empty());	// Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = window->DC.GroupStack.back();

    ImRect group_bb(group_data.BackupCursorPos, window->DC.CursorMaxPos);
    group_bb.Max.y -= g.Style.ItemSpacing.y;      // Cancel out last vertical spacing because we are adding one ourselves.
    group_bb.Max = ImMax(group_bb.Min, group_bb.Max);

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.CurrentLineHeight = group_data.BackupCurrentLineHeight;
    window->DC.CurrentLineTextBaseOffset = group_data.BackupCurrentLineTextBaseOffset;
    window->DC.IndentX = group_data.BackupIndentX;
    window->DC.GroupOffsetX = group_data.BackupGroupOffsetX;
    window->DC.LogLinePosY = window->DC.CursorPos.y - 9999.0f;

    if (group_data.AdvanceCursor)
    {
        window->DC.CurrentLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrentLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
        ItemSize(group_bb.GetSize(), group_data.BackupCurrentLineTextBaseOffset);
        ItemAdd(group_bb, NULL);
    }

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive() will function on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but if you search for LastItemId you'll notice it is only used in that context.
    if (!group_data.BackupActiveIdIsAlive && g.ActiveIdIsAlive && g.ActiveId && g.ActiveIdWindow->RootWindow == window->RootWindow)
        window->DC.LastItemId = g.ActiveId;

    window->DC.GroupStack.pop_back();

    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, 0xFFFF00FF);   // Debug
}